

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O1

bool __thiscall llama_grammar_parser::parse(llama_grammar_parser *this,char *src)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  pointer pvVar3;
  pointer pvVar4;
  _Base_ptr p_Var5;
  pointer plVar6;
  char *pos;
  _Base_ptr p_Var7;
  runtime_error *prVar8;
  long *plVar9;
  pointer pvVar10;
  long *plVar11;
  ulong uVar12;
  pointer plVar13;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while (uVar12 = (ulong)(byte)*src, uVar12 < 0x24) {
    if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
      if (uVar12 != 0x23) break;
      while ((0xd < (byte)*src || ((0x2401U >> ((byte)*src & 0x1f) & 1) == 0))) {
        src = (char *)((byte *)src + 1);
      }
    }
    else {
      src = (char *)((byte *)src + 1);
    }
  }
  for (; *src != 0; src = parse_rule(this,src)) {
  }
  pvVar3 = (this->rules).
           super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->rules).
           super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar4) {
    p_Var5 = (this->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->symbol_ids)._M_t._M_impl.super__Rb_tree_header;
    pvVar10 = pvVar3;
    do {
      plVar13 = (pvVar10->
                super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>).
                _M_impl.super__Vector_impl_data._M_start;
      plVar6 = (pvVar10->
               super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (plVar13 == plVar6) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Undefined rule");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      do {
        if (plVar13->type == LLAMA_GRETYPE_RULE_REF) {
          _Var2 = plVar13->value;
          uVar12 = (ulong)_Var2;
          p_Var7 = p_Var5;
          if ((ulong)(((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555) <= uVar12)
          goto joined_r0x001955fd;
          if (pvVar3[uVar12].
              super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              pvVar3[uVar12].
              super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
              _M_impl.super__Vector_impl_data._M_finish && (_Rb_tree_header *)p_Var5 != p_Var1) {
            do {
              if (p_Var7[2]._M_color == _Var2) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_50,"Undefined rule identifier \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var7 + 1));
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                local_70 = (long *)*plVar9;
                plVar11 = plVar9 + 2;
                if (local_70 == plVar11) {
                  local_60 = *plVar11;
                  lStack_58 = plVar9[3];
                  local_70 = &local_60;
                }
                else {
                  local_60 = *plVar11;
                }
                local_68 = plVar9[1];
                *plVar9 = (long)plVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::runtime_error::runtime_error(prVar8,(string *)&local_70);
                __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
joined_r0x001955fd:
            } while ((_Rb_tree_header *)p_Var7 != p_Var1);
          }
        }
        plVar13 = plVar13 + 1;
      } while (plVar13 != plVar6);
      pvVar10 = pvVar10 + 1;
    } while (pvVar10 != pvVar4);
  }
  return true;
}

Assistant:

bool llama_grammar_parser::parse(const char * src) {
    try {
        const char * pos = parse_space(src, true);
        while (*pos) {
            pos = parse_rule(pos);
        }
        // Validate the state to ensure that all rules are defined
        for (const auto & rule : rules) {
            if (rule.empty()) {
                throw std::runtime_error("Undefined rule");
            }
            for (const auto & elem : rule) {
                if (elem.type == LLAMA_GRETYPE_RULE_REF) {
                    // Ensure that the rule at that location exists
                    if (elem.value >= rules.size() || rules[elem.value].empty()) {
                        // Get the name of the rule that is missing
                        for (const auto & kv : symbol_ids) {
                            if (kv.second == elem.value) {
                                throw std::runtime_error("Undefined rule identifier '" + kv.first + "'");
                            }
                        }
                    }
                }
            }
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "%s: error parsing grammar: %s\n\n%s\n", __func__, err.what(), src);
        rules.clear();
        return false;
    }

    return true;
}